

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

ArgumentMismatch *
CLI::ArgumentMismatch::AtLeast
          (ArgumentMismatch *__return_storage_ptr__,string *name,int num,size_t received)

{
  string sStack_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ::std::operator+(&local_98,name,": At least ");
  std::__cxx11::to_string(&local_b8,num);
  ::std::operator+(&local_78,&local_98,&local_b8);
  ::std::operator+(&local_58,&local_78," required but received ");
  std::__cxx11::to_string(&sStack_d8,received);
  ::std::operator+(&local_38,&local_58,&sStack_d8);
  ArgumentMismatch(__return_storage_ptr__,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&sStack_d8);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

static ArgumentMismatch AtLeast(std::string name, int num, std::size_t received) {
        return ArgumentMismatch(name + ": At least " + std::to_string(num) + " required but received " +
                                std::to_string(received));
    }